

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::FreeEntry(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
            *this,EntryType *current)

{
  EntryType *current_local;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  
  this->count = this->count - 1;
  if (this->freecount < 10) {
    current->key = (void *)0x0;
    Memory::Recycler::PinRecord::operator=(&current->value,0);
    current->next = this->free;
    this->free = current;
    this->freecount = this->freecount + 1;
  }
  else {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,SimpleHashEntry<void*,Memory::Recycler::PinRecord>>
              (this->allocator,current);
  }
  return;
}

Assistant:

void FreeEntry(EntryType* current)
    {
        count--;
        if ( freecount < 10 )
        {
            current->key = nullptr;
            current->value = NULL;
            current->next = free;
            free = current;
            freecount++;
        }
        else
        {
            AllocatorDelete(TAllocator, allocator, current);
        }
    }